

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_initializer
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,dtl_dv_t **dv)

{
  apx_attributeParseState_t *paVar1;
  uint8_t *next;
  dtl_dv_t **dv_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_attributeParser_t *self_local;
  
  if ((((self == (apx_attributeParser_t *)0x0) || (begin == (uint8_t *)0x0)) ||
      (end == (uint8_t *)0x0)) || ((end < begin || (dv == (dtl_dv_t **)0x0)))) {
    self_local = (apx_attributeParser_t *)0x0;
  }
  else {
    apx_attributeParser_reset(self);
    paVar1 = apx_attributeParseState_new();
    self->state = paVar1;
    if (self->state == (apx_attributeParseState_t *)0x0) {
      apx_attributeParser_set_error(self,2,begin);
    }
    self_local = (apx_attributeParser_t *)apx_attributeParser_parse_initializer_list(self,begin,end)
    ;
    if (begin < self_local) {
      if (end < self_local) {
        __assert_fail("next <= end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                      ,0x150,
                      "const uint8_t *apx_attributeParser_parse_initializer(apx_attributeParser_t *, const uint8_t *, const uint8_t *, dtl_dv_t **)"
                     );
      }
      if (self->state->initializer_list == (dtl_av_t *)0x0) {
        if (self->state->sv != (dtl_sv_t *)0x0) {
          *dv = (dtl_dv_t *)self->state->sv;
          self->state->sv = (dtl_sv_t *)0x0;
        }
      }
      else {
        *dv = (dtl_dv_t *)self->state->initializer_list;
        self->state->initializer_list = (dtl_av_t *)0x0;
      }
    }
    if (self_local == (apx_attributeParser_t *)0x0) {
      apx_attributeParser_set_error(self,3,begin);
    }
    apx_attributeParseState_delete(self->state);
    self->state = (apx_attributeParseState_t *)0x0;
  }
  return (uint8_t *)self_local;
}

Assistant:

uint8_t const* apx_attributeParser_parse_initializer(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, dtl_dv_t** dv)
{
   if ((self != NULL) && (begin != NULL) && (end != NULL) && (begin <= end) && (dv != NULL))
   {
      uint8_t const* next;
      apx_attributeParser_reset(self);
      self->state = apx_attributeParseState_new();
      if (self->state == NULL)
      {
         apx_attributeParser_set_error(self, APX_MEM_ERROR, begin);
      }
      next = apx_attributeParser_parse_initializer_list(self, begin, end);
      if (next > begin)
      {
         assert(next <= end);
         if (self->state->initializer_list != NULL)
         {
            *dv = (dtl_dv_t*)self->state->initializer_list;
            self->state->initializer_list = NULL;
         }
         else if (self->state->sv != NULL)
         {
            *dv = (dtl_dv_t*)self->state->sv;
            self->state->sv = NULL;
         }
      }
      if (next == NULL)
      {
         apx_attributeParser_set_error(self, APX_PARSE_ERROR, begin);
      }
      apx_attributeParseState_delete(self->state);
      self->state = NULL;
      return next;
   }
   return NULL;
}